

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsim_context.cpp
# Opt level: O0

void __thiscall lsim::LSimContext::add_folder(LSimContext *this,char *name,char *path)

{
  char *pcVar1;
  char *pcVar2;
  mapped_type *this_00;
  allocator local_41;
  key_type local_40;
  char *local_20;
  char *path_local;
  char *name_local;
  LSimContext *this_local;
  
  local_20 = path;
  path_local = name;
  name_local = (char *)this;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_folders,
             &path_local);
  pcVar2 = path_local;
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,pcVar2,&local_41);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_folder_lut,&local_40);
  std::__cxx11::string::operator=((string *)this_00,pcVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void LSimContext::add_folder(const char *name, const char *path) {
    m_folders.emplace_back(name);
    m_folder_lut[name] = path;
}